

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<slang::Diagnostic,_2UL>::SmallVector
          (SmallVector<slang::Diagnostic,_2UL> *this,Base *other)

{
  move_iterator<slang::Diagnostic_*> first;
  size_type sVar1;
  long lVar2;
  pointer __location;
  
  (this->super_SmallVectorBase<slang::Diagnostic>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::Diagnostic>).firstElement;
  (this->super_SmallVectorBase<slang::Diagnostic>).len = 0;
  (this->super_SmallVectorBase<slang::Diagnostic>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current == (Diagnostic *)other->firstElement) {
    (this->super_SmallVectorBase<slang::Diagnostic>).cap = 2;
    SmallVectorBase<slang::Diagnostic>::append<std::move_iterator<slang::Diagnostic_*>_>
              (&this->super_SmallVectorBase<slang::Diagnostic>,first,first._M_current + other->len);
    if (other->len != 0) {
      __location = other->data_;
      lVar2 = other->len * 0x70;
      do {
        std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                  ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
        __location = __location + 1;
        lVar2 = lVar2 + -0x70;
      } while (lVar2 != 0);
    }
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<slang::Diagnostic>).data_ = first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<slang::Diagnostic>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<slang::Diagnostic>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }